

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_remote_port(Curl_easy *data,connectdata *conn)

{
  undefined4 uVar1;
  long lVar2;
  unsigned_short uVar3;
  int iVar4;
  char *pcVar5;
  unsigned_long ulnum;
  char *pcVar6;
  char *pcVar7;
  uint local_64;
  long port;
  char *rest;
  char type [12];
  char *url;
  char *pcStack_28;
  char endbracket;
  char *portptr;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  portptr = (char *)conn;
  conn_local = (connectdata *)data;
  iVar4 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",(long)&url + 7);
  if ((iVar4 == 1) && (url._7_1_ == ']')) {
    portptr[0x3da] = '\x01';
    *(long *)(portptr + 0xd8) = *(long *)(portptr + 0xd8) + 1;
    pcVar5 = strchr(*(char **)(portptr + 0xd8),0x5d);
    pcStack_28 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      pcStack_28 = pcVar5 + 1;
      *pcVar5 = '\0';
      if (*pcStack_28 != ':') {
        pcStack_28 = (char *)0x0;
      }
    }
  }
  else {
    pcStack_28 = strchr(*(char **)(portptr + 0xd8),0x3a);
  }
  lVar2._0_4_ = conn_local->httpversion;
  lVar2._4_4_ = conn_local->rtspversion;
  if ((lVar2 == 0) || ((conn_local[10].port & 1) == 0)) {
    if (pcStack_28 != (char *)0x0) {
      ulnum = strtol(pcStack_28 + 1,(char **)&port,10);
      if (((long)ulnum < 0) || (0xffff < (long)ulnum)) {
        Curl_failf((Curl_easy *)conn_local,"Port number out of range");
        return CURLE_URL_MALFORMAT;
      }
      if (*(char *)port != '\0') {
        Curl_failf((Curl_easy *)conn_local,"Port number ended with \'%c\'",
                   (ulong)(uint)(int)*(char *)port);
        return CURLE_URL_MALFORMAT;
      }
      if ((char *)port == pcStack_28 + 1) {
        *pcStack_28 = '\0';
      }
      else {
        *pcStack_28 = '\0';
        uVar3 = curlx_ultous(ulnum);
        *(uint *)(portptr + 0x198) = (uint)uVar3;
      }
    }
  }
  else {
    uVar1 = conn_local->httpversion;
    *(uint *)(portptr + 0x198) = uVar1 & 0xffff;
    if (pcStack_28 != (char *)0x0) {
      *pcStack_28 = '\0';
    }
    if ((portptr[0x3d6] & 1U) != 0) {
      memset((void *)((long)&rest + 4),0,0xc);
      if ((portptr[0x3ec] & 1U) != 0) {
        if ((conn_local->syserr_buf[0x93] & 1U) == 0) {
          local_64 = 0x49;
          if ((conn_local->syserr_buf[0x95] & 1U) != 0) {
            local_64 = 0x44;
          }
        }
        else {
          local_64 = 0x41;
        }
        curl_msnprintf((char *)((long)&rest + 4),0xc,";type=%c",(ulong)local_64);
      }
      pcVar5 = "";
      if ((portptr[0x3da] & 1U) != 0) {
        pcVar5 = "[";
      }
      pcVar6 = "";
      if ((portptr[0x3da] & 1U) != 0) {
        pcVar6 = "]";
      }
      pcVar7 = "";
      if (((ulong)conn_local[10].seek_func & 1) != 0) {
        pcVar7 = "/";
      }
      type._4_8_ = curl_maprintf("%s://%s%s%s:%hu%s%s%s",**(undefined8 **)(portptr + 0x420),pcVar5,
                                 *(undefined8 *)(portptr + 0xd8),pcVar6,
                                 (ulong)*(uint *)(portptr + 0x198),pcVar7,conn_local[10].buf_len,
                                 (long)&rest + 4);
      if ((char *)type._4_8_ == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (((ulong)conn_local[1].http_proxy.host.rawalloc & 1) != 0) {
        (*Curl_cfree)(conn_local[1].socks_proxy.passwd);
        conn_local[1].socks_proxy.passwd = (char *)0x0;
        *(undefined1 *)&conn_local[1].http_proxy.host.rawalloc = 0;
      }
      conn_local[1].socks_proxy.passwd = (char *)type._4_8_;
      *(undefined1 *)&conn_local[1].http_proxy.host.rawalloc = 1;
    }
  }
  if (*(int *)(portptr + 0x198) < 0) {
    *(uint *)(portptr + 0x198) = (uint)*(undefined8 *)(*(long *)(portptr + 0x420) + 0x70) & 0xffff;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode parse_remote_port(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  char *portptr;
  char endbracket;

  /* Note that at this point, the IPv6 address cannot contain any scope
     suffix as that has already been removed in the parseurlandfillconn()
     function */
  if((1 == sscanf(conn->host.name, "[%*45[0123456789abcdefABCDEF:.]%c",
                  &endbracket)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    conn->bits.ipv6_ip = TRUE;

    conn->host.name++; /* skip over the starting bracket */
    portptr = strchr(conn->host.name, ']');
    if(portptr) {
      *portptr++ = '\0'; /* zero terminate, killing the bracket */
      if(':' != *portptr)
        portptr = NULL; /* no port number available */
    }
  }
  else {
#ifdef ENABLE_IPV6
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, conn->host.name, &in6) > 0) {
      /* This is a numerical IPv6 address, meaning this is a wrongly formatted
         URL */
      failf(data, "IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
#endif

    portptr = strchr(conn->host.name, ':');
  }

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this and ignore the port possibly given in the URL */
    conn->remote_port = (unsigned short)data->set.use_port;
    if(portptr)
      *portptr = '\0'; /* cut off the name there anyway - if there was a port
                      number - since the port number is to be ignored! */
    if(conn->bits.httpproxy) {
      /* we need to create new URL with the new port number */
      char *url;
      char type[12]="";

      if(conn->bits.type_set)
        snprintf(type, sizeof(type), ";type=%c",
                 data->set.prefer_ascii?'A':
                 (data->set.ftp_list_only?'D':'I'));

      /*
       * This synthesized URL isn't always right--suffixes like ;type=A are
       * stripped off. It would be better to work directly from the original
       * URL and simply replace the port part of it.
       */
      url = aprintf("%s://%s%s%s:%hu%s%s%s", conn->given->scheme,
                    conn->bits.ipv6_ip?"[":"", conn->host.name,
                    conn->bits.ipv6_ip?"]":"", conn->remote_port,
                    data->state.slash_removed?"/":"", data->state.path,
                    type);
      if(!url)
        return CURLE_OUT_OF_MEMORY;

      if(data->change.url_alloc) {
        Curl_safefree(data->change.url);
        data->change.url_alloc = FALSE;
      }

      data->change.url = url;
      data->change.url_alloc = TRUE;
    }
  }
  else if(portptr) {
    /* no CURLOPT_PORT given, extract the one from the URL */

    char *rest;
    long port;

    port=strtol(portptr+1, &rest, 10);  /* Port number must be decimal */

    if((port < 0) || (port > 0xffff)) {
      /* Single unix standard says port numbers are 16 bits long */
      failf(data, "Port number out of range");
      return CURLE_URL_MALFORMAT;
    }

    if(rest[0]) {
      failf(data, "Port number ended with '%c'", rest[0]);
      return CURLE_URL_MALFORMAT;
    }

    if(rest != &portptr[1]) {
      *portptr = '\0'; /* cut off the name there */
      conn->remote_port = curlx_ultous(port);
    }
    else {
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
    }
  }

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}